

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

BBLIter __thiscall mocker::ir::FunctionModule::insertBBAfter(FunctionModule *this,BBLIter iter)

{
  const_iterator __position;
  iterator iVar1;
  size_t local_8;
  
  if ((_List_node_base *)&this->bbs != iter._M_node) {
    __position._M_node = (iter._M_node)->_M_next;
    local_8 = this->bbsSz;
    this->bbsSz = local_8 + 1;
    iVar1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
            emplace<unsigned_long>(&this->bbs,__position,&local_8);
    return (BBLIter)iVar1._M_node;
  }
  __assert_fail("iter != bbs.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/module.cpp"
                ,0x40,"BBLIter mocker::ir::FunctionModule::insertBBAfter(BBLIter)");
}

Assistant:

BBLIter FunctionModule::insertBBAfter(BBLIter iter) {
  assert(iter != bbs.end());
  ++iter;
  return bbs.emplace(iter, bbsSz++);
}